

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::PLApproximator(PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                 *this,PowConstExpConstraint *con,PLApproxParams *p)

{
  initializer_list<double> __l;
  undefined8 *in_RDI;
  PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  *in_stack_000000f0;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  *in_stack_ffffffffffffff88;
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  *in_stack_ffffffffffffff90;
  double local_58 [2];
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  iterator pdVar1;
  size_type sVar2;
  
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
  ::BasicPLApproximator
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(PLApproxParams *)0x71d46c);
  *in_RDI = &PTR__PLApproximator_0097c8f8;
  Range::Range((Range *)(in_RDI + 9),-1e+100,1e+100);
  in_RDI[0xb] = 0xc12e848000000000;
  in_RDI[0xc] = 0x412e848000000000;
  in_RDI[0xd] = 0xc12e848000000000;
  in_RDI[0xe] = 0x412e848000000000;
  *(undefined1 *)(in_RDI + 0xf) = 0;
  __a = (allocator_type *)0x412e848000000000;
  local_58[0] = -1000000.0;
  local_58[1] = 0.0;
  pdVar1 = local_58;
  sVar2 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x71d502);
  __l._M_len = sVar2;
  __l._M_array = pdVar1;
  std::vector<double,_std::allocator<double>_>::vector(in_stack_ffffffffffffffc0,__l,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x71d526);
  InitPowDomain(in_stack_000000f0);
  return;
}

Assistant:

PLApproximator(const PowConstExpConstraint& con, PLApproxParams& p) :
    BasicPLApproximator<PowConstExpConstraint>(con, p) {
    InitPowDomain();
  }